

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O1

int i2r_certpol(X509V3_EXT_METHOD *method,void *ext,BIO *out,int indent)

{
  uint uVar1;
  OPENSSL_STACK *sk;
  undefined8 *puVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  undefined8 *puVar7;
  size_t sVar8;
  ASN1_INTEGER *aint;
  size_t sVar9;
  size_t sVar10;
  undefined4 in_register_0000000c;
  char *pcVar11;
  undefined8 uVar12;
  uint uVar13;
  NOTICEREF *ref;
  bool bVar14;
  
  sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)ext);
  if (sVar6 != 0) {
    uVar13 = indent + 4;
    sVar6 = 0;
    do {
      puVar7 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)ext,sVar6);
      BIO_printf((BIO *)out,"%*sPolicy: ",CONCAT44(in_register_0000000c,indent),"");
      i2a_ASN1_OBJECT((BIO *)out,(ASN1_OBJECT *)*puVar7);
      BIO_puts((BIO *)out,"\n");
      sk = (OPENSSL_STACK *)puVar7[1];
      if (sk != (OPENSSL_STACK *)0x0) {
        sVar8 = OPENSSL_sk_num(sk);
        if (sVar8 != 0) {
          sVar8 = 0;
          do {
            puVar7 = (undefined8 *)OPENSSL_sk_value(sk,sVar8);
            iVar5 = OBJ_obj2nid((ASN1_OBJECT *)*puVar7);
            if (iVar5 == 0xa5) {
              BIO_printf((BIO *)out,"%*sUser Notice:\n",(ulong)(indent + 2U),"");
              puVar7 = (undefined8 *)puVar7[1];
              puVar2 = (undefined8 *)*puVar7;
              if (puVar2 != (undefined8 *)0x0) {
                BIO_printf((BIO *)out,"%*sOrganization: %.*s\n",(ulong)uVar13,"",
                           (ulong)*(uint *)*puVar2,*(undefined8 *)((uint *)*puVar2 + 2));
                sVar10 = OPENSSL_sk_num((OPENSSL_STACK *)puVar2[1]);
                pcVar11 = "";
                if (1 < sVar10) {
                  pcVar11 = "s";
                }
                BIO_printf((BIO *)out,"%*sNumber%s: ",(ulong)uVar13,"",pcVar11);
                sVar10 = OPENSSL_sk_num((OPENSSL_STACK *)puVar2[1]);
                bVar14 = sVar10 != 0;
                if (bVar14) {
                  sVar10 = 0;
                  do {
                    aint = (ASN1_INTEGER *)OPENSSL_sk_value((OPENSSL_STACK *)puVar2[1],sVar10);
                    if (sVar10 != 0) {
                      BIO_puts((BIO *)out,", ");
                    }
                    if (aint == (ASN1_INTEGER *)0x0) {
                      BIO_puts((BIO *)out,"(null)");
                    }
                    else {
                      pcVar11 = i2s_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,aint);
                      if (pcVar11 == (char *)0x0) goto LAB_003236d7;
                      BIO_puts((BIO *)out,pcVar11);
                      OPENSSL_free(pcVar11);
                    }
                    sVar10 = sVar10 + 1;
                    sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)puVar2[1]);
                    bVar14 = sVar10 < sVar9;
                  } while (bVar14);
                }
                BIO_puts((BIO *)out,"\n");
LAB_003236d7:
                if (bVar14) goto LAB_0032374d;
              }
              puVar3 = (uint *)puVar7[1];
              if (puVar3 != (uint *)0x0) {
                uVar1 = *puVar3;
                uVar12 = *(undefined8 *)(puVar3 + 2);
                pcVar11 = "%*sExplicit Text: %.*s\n";
                uVar4 = uVar13;
                goto LAB_00323708;
              }
            }
            else if (iVar5 == 0xa4) {
              uVar1 = *(uint *)puVar7[1];
              uVar12 = *(undefined8 *)((uint *)puVar7[1] + 2);
              pcVar11 = "%*sCPS: %.*s\n";
              uVar4 = indent + 2U;
LAB_00323708:
              BIO_printf((BIO *)out,pcVar11,(ulong)uVar4,"",(ulong)uVar1,uVar12);
            }
            else {
              BIO_printf((BIO *)out,"%*sUnknown Qualifier: ",(ulong)uVar13,"");
              i2a_ASN1_OBJECT((BIO *)out,(ASN1_OBJECT *)*puVar7);
              BIO_puts((BIO *)out,"\n");
            }
LAB_0032374d:
            sVar8 = sVar8 + 1;
            sVar10 = OPENSSL_sk_num(sk);
          } while (sVar8 < sVar10);
        }
      }
      sVar6 = sVar6 + 1;
      sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)ext);
    } while (sVar6 < sVar8);
  }
  return 1;
}

Assistant:

static int i2r_certpol(const X509V3_EXT_METHOD *method, void *ext, BIO *out,
                       int indent) {
  const STACK_OF(POLICYINFO) *pol =
      reinterpret_cast<const STACK_OF(POLICYINFO) *>(ext);
  // First print out the policy OIDs
  for (size_t i = 0; i < sk_POLICYINFO_num(pol); i++) {
    const POLICYINFO *pinfo = sk_POLICYINFO_value(pol, i);
    BIO_printf(out, "%*sPolicy: ", indent, "");
    i2a_ASN1_OBJECT(out, pinfo->policyid);
    BIO_puts(out, "\n");
    if (pinfo->qualifiers) {
      print_qualifiers(out, pinfo->qualifiers, indent + 2);
    }
  }
  return 1;
}